

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap.cpp
# Opt level: O1

file_mapping * __thiscall
libtorrent::aux::file_mapping::operator=(file_mapping *this,file_mapping *rhs)

{
  if (rhs != this) {
    if (this->m_mapping != (void *)0x0) {
      munmap(this->m_mapping,this->m_size);
      this->m_mapping = (void *)0x0;
    }
    file_handle::operator=(&this->m_file,&rhs->m_file);
    this->m_size = rhs->m_size;
    this->m_mapping = rhs->m_mapping;
    rhs->m_mapping = (void *)0x0;
  }
  return this;
}

Assistant:

file_mapping& file_mapping::operator=(file_mapping&& rhs) &
{
	if (&rhs == this) return *this;
	close();
	m_file = std::move(rhs.m_file);
	m_size = rhs.m_size;
	m_mapping = rhs.m_mapping;
	rhs.m_mapping = nullptr;
	return *this;
}